

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPValueIteration.cpp
# Opt level: O2

void __thiscall
MDPValueIteration::
Plan<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
          (MDPValueIteration *this,
          vector<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
          *T)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  PlanningUnitDecPOMDPDiscrete *this_00;
  size_t sVar6;
  DecPOMDPDiscreteInterface *pDVar7;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar8;
  pointer pQVar9;
  undefined1 auVar10 [16];
  size_t S;
  ulong A;
  ulong uVar11;
  ulong uVar12;
  self_type *m;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar13;
  pointer ppmVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  const_iterator2 ci_1;
  const_iterator2 ci;
  QTable oldQtable;
  QTable immReward;
  double local_110;
  ulong local_108;
  ulong local_100;
  const_iterator1 local_e8;
  string local_d8;
  TimedAlgorithm *local_b8;
  ulong local_b0;
  undefined1 local_a8 [16];
  undefined1 auStack_98 [16];
  undefined8 local_88;
  long lStack_80;
  double local_78;
  QTable local_70;
  const_iterator1 local_40;
  
  this_00 = (this->super_MDPSolver)._m_pu;
  sVar6 = (this_00->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  S = PlanningUnitMADPDiscrete::GetNrStates(&this_00->super_PlanningUnitMADPDiscrete);
  A = (**(code **)((long)*(((this->super_MDPSolver)._m_pu)->super_PlanningUnitMADPDiscrete)._m_madp
                  + 0x68))();
  pDVar7 = ((this->super_MDPSolver)._m_pu)->_m_DecPOMDP;
  local_b0 = (**(code **)(*(long *)((long)&pDVar7->field_0x0 + *(long *)(*(long *)pDVar7 + -0xb0)) +
                         0x70))((long)&pDVar7->field_0x0 + *(long *)(*(long *)pDVar7 + -0xb0));
  QTable::QTable(&local_70,S,A);
  for (uVar17 = 0; uVar15 = (ulong)uVar17, uVar15 < S; uVar17 = uVar17 + 1) {
    for (uVar11 = 0; uVar11 < A; uVar11 = (ulong)((int)uVar11 + 1)) {
      pDVar7 = ((this->super_MDPSolver)._m_pu)->_m_DecPOMDP;
      dVar21 = (double)(**(code **)(*(long *)pDVar7 + 0xc0))(pDVar7,uVar15,uVar11);
      local_70.super_matrix_t.data_.data_[local_70.super_matrix_t.size2_ * uVar15 + uVar11] = dVar21
      ;
    }
  }
  if (this->_m_finiteHorizon == false) {
    local_88 = 0;
    lStack_80 = 0;
    local_a8._8_8_ = (pointer)0x0;
    auStack_98._0_8_ = 0;
    local_a8._0_8_ = &PTR_Get_00604bb0;
    local_110 = 1.79769313486232e+308;
    while (0.0001 < local_110) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"Iteration",(allocator<char> *)&local_e8);
      TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      boost::numeric::ublas::
      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::operator=((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)(local_a8 + 8),
                  &((this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>._M_impl.
                    super__Vector_impl_data._M_start)->super_matrix_t);
      local_110 = 0.0;
      for (uVar17 = 0; uVar15 = (ulong)uVar17, uVar15 < A; uVar17 = uVar17 + 1) {
        ppmVar14 = (T->
                   super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        local_d8._M_dataplus._M_p = (pointer)ppmVar14[uVar15];
        local_d8._M_string_length =
             (size_type)
             (((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)local_d8._M_dataplus._M_p)->data_).data_;
        while (pmVar13 = ppmVar14[uVar15],
              (pointer)local_d8._M_string_length !=
              (pmVar13->data_).data_ + pmVar13->size2_ * pmVar13->size1_) {
          if (*(ulong *)(local_d8._M_dataplus._M_p + 8) == 0) {
            uVar11 = 0;
          }
          else {
            uVar11 = (ulong)((long)(local_d8._M_string_length -
                                   (long)*(pointer *)(local_d8._M_dataplus._M_p + 0x20)) >> 3) /
                     *(ulong *)(local_d8._M_dataplus._M_p + 8) & 0xffffffff;
          }
          dVar21 = local_70.super_matrix_t.data_.data_
                   [local_70.super_matrix_t.size2_ * uVar11 + uVar15];
          boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator1::begin(&local_e8);
          local_108 = 0;
          while (boost::numeric::ublas::
                 matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::const_iterator1::end(&local_40), local_e8.it_ != local_40.it_) {
            if ((local_e8.
                 super_container_const_reference<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                .c_)->size2_ == 0) {
              uVar12 = 0;
            }
            else {
              uVar12 = (ulong)((long)local_e8.it_ -
                               (long)((local_e8.
                                       super_container_const_reference<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                                      .c_)->data_).data_ >> 3) %
                       (local_e8.
                        super_container_const_reference<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                       .c_)->size2_ & 0xffffffff;
            }
            auVar20 = ZEXT816(0xffefffffffffffff);
            for (uVar16 = 0; uVar16 < A; uVar16 = uVar16 + 1) {
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)(lStack_80 + (uVar12 * auStack_98._0_8_ + (ulong)uVar16) * 8)
              ;
              auVar20 = vmaxsd_avx(auVar20,auVar4);
            }
            auVar27._8_8_ = 0;
            auVar27._0_8_ = local_108;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *local_e8.it_;
            auVar20 = vfmadd231sd_fma(auVar27,auVar20,auVar5);
            local_e8.it_ = local_e8.it_ + 1;
            local_108 = auVar20._0_8_;
          }
          pQVar9 = (this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>._M_impl.
                   super__Vector_impl_data._M_start;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = dVar21;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = local_108;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_b0;
          auVar20 = vfmadd132sd_fma(auVar28,auVar23,auVar20);
          (pQVar9->super_matrix_t).data_.data_[(pQVar9->super_matrix_t).size2_ * uVar11 + uVar15] =
               auVar20._0_8_;
          ppmVar14 = (T->
                     super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          local_d8._M_string_length =
               local_d8._M_string_length + *(size_type *)(local_d8._M_dataplus._M_p + 8) * 8;
          auVar10._8_8_ = 0x7fffffffffffffff;
          auVar10._0_8_ = 0x7fffffffffffffff;
          auVar24._8_8_ = 0;
          auVar24._0_8_ =
               *(double *)(lStack_80 + (uVar11 * auStack_98._0_8_ + uVar15) * 8) - auVar20._0_8_;
          auVar20 = vandpd_avx512vl(auVar24,auVar10);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_110;
          auVar20 = vmaxsd_avx(auVar20,auVar29);
          local_110 = auVar20._0_8_;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"Iteration",(allocator<char> *)&local_e8);
      TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
              ((unbounded_array<double,_std::allocator<double>_> *)(auStack_98 + 8));
  }
  else {
    uVar15 = sVar6 - 1;
    local_b8 = &this->super_TimedAlgorithm;
    local_100 = uVar15;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a8,"Iteration",(allocator<char> *)&local_d8);
      TimedAlgorithm::StartTimer(local_b8,(string *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
      for (uVar17 = 0; uVar11 = (ulong)uVar17, uVar11 < A; uVar17 = uVar17 + 1) {
        ppmVar14 = (T->
                   super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        pmVar13 = ppmVar14[uVar11];
        local_a8._0_8_ = pmVar13;
        for (local_a8._8_8_ = (pmVar13->data_).data_; pmVar8 = ppmVar14[uVar11],
            (pointer)local_a8._8_8_ != (pmVar8->data_).data_ + pmVar8->size2_ * pmVar8->size1_;
            local_a8._8_8_ = local_a8._8_8_ + uVar12 * 8) {
          uVar12 = pmVar13->size2_;
          if (uVar12 == 0) {
            uVar18 = 0;
          }
          else {
            uVar18 = (ulong)(local_a8._8_8_ - (long)(pmVar13->data_).data_ >> 3) / uVar12 &
                     0xffffffff;
          }
          auVar25 = ZEXT816(0) << 0x40;
          dVar21 = local_70.super_matrix_t.data_.data_
                   [local_70.super_matrix_t.size2_ * uVar18 + uVar11];
          if (local_100 < uVar15) {
            local_78 = local_70.super_matrix_t.data_.data_
                       [local_70.super_matrix_t.size2_ * uVar18 + uVar11];
            boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::const_iterator1::begin((const_iterator1 *)&local_d8);
            local_108 = 0;
            while (boost::numeric::ublas::
                   matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::const_iterator1::end(&local_e8),
                  (const_subiterator_type)local_d8._M_string_length != local_e8.it_) {
              if (*(ulong *)(local_d8._M_dataplus._M_p + 8) == 0) {
                uVar12 = 0;
              }
              else {
                uVar12 = (ulong)((long)(local_d8._M_string_length -
                                       (long)*(pointer *)(local_d8._M_dataplus._M_p + 0x20)) >> 3) %
                         *(ulong *)(local_d8._M_dataplus._M_p + 8) & 0xffffffff;
              }
              auVar20 = ZEXT816(0xffefffffffffffff);
              pQVar9 = (this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              for (uVar16 = 0; uVar16 < A; uVar16 = uVar16 + 1) {
                auVar1._8_8_ = 0;
                auVar1._0_8_ = pQVar9[local_100 + 1].super_matrix_t.data_.data_
                               [pQVar9[local_100 + 1].super_matrix_t.size2_ * uVar12 + (ulong)uVar16
                               ];
                auVar20 = vmaxsd_avx(auVar20,auVar1);
              }
              auVar26._8_8_ = 0;
              auVar26._0_8_ = local_108;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(double *)local_d8._M_string_length;
              auVar20 = vfmadd231sd_fma(auVar26,auVar20,auVar2);
              local_d8._M_string_length = local_d8._M_string_length + 8;
              local_108 = auVar20._0_8_;
            }
            auVar25._8_8_ = 0;
            auVar25._0_8_ = local_108;
            ppmVar14 = (T->
                       super__Vector_base<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            uVar12 = *(size_type *)(local_a8._0_8_ + 8);
            pmVar13 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                       *)local_a8._0_8_;
            dVar21 = local_78;
          }
          pQVar9 = (this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>._M_impl.
                   super__Vector_impl_data._M_start;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_b0;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = dVar21;
          auVar20 = vfmadd132sd_fma(auVar25,auVar22,auVar3);
          pQVar9[local_100].super_matrix_t.data_.data_
          [uVar18 * pQVar9[local_100].super_matrix_t.size2_ + uVar11] = auVar20._0_8_;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a8,"Iteration",(allocator<char> *)&local_d8);
      TimedAlgorithm::StopTimer(local_b8,(string *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
      bVar19 = local_100 != 0;
      local_100 = local_100 - 1;
    } while (bVar19);
  }
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (&local_70.super_matrix_t.data_);
  return;
}

Assistant:

void MDPValueIteration::Plan(std::vector<const M*> T)
{
    size_t horizon = GetPU()->GetHorizon();
    size_t nrS = GetPU()->GetNrStates();
    size_t nrJA =  GetPU()->GetNrJointActions();
    
    Index sI,ssucI;
    double gamma=GetPU()->GetDiscount();
    double R_i,R_f,maxQsuc;
    
    // cache immediate reward for speed
    QTable immReward(nrS,nrJA);
    for(Index sI = 0; sI < nrS; sI++)
        for(Index jaI = 0; jaI < nrJA; jaI++)
            immReward(sI,jaI)=GetPU()->GetReward(sI, jaI);
    
    if(_m_finiteHorizon)
    {
        for(size_t t = horizon - 1; true; t--)
        {
            StartTimer("Iteration");
            for(Index jaI = 0; jaI < nrJA; jaI++)
            {
                for(typename M::const_iterator1 ri=T[jaI]->begin1();
                    ri!=T[jaI]->end1(); ++ri)
                {
                    sI=ri.index1();
                    
                    //calc. expected immediate reward
                    R_i = immReward(sI,jaI);
                    R_f = 0.0;
                    if(t < horizon - 1)
                    {
                        //calc. expected future reward
                        for (typename M::const_iterator2 ci = ri.begin();
                             ci != ri.end(); ++ci)
                        {
                            ssucI=ci.index2();
                            //find the best action at ssucI
                            maxQsuc = -DBL_MAX;
                            for(Index jasucI = 0; jasucI < nrJA; jasucI++)
                                maxQsuc = std::max( _m_QValues[t+1](ssucI,jasucI),
                                                    maxQsuc);
                            
                            R_f += *ci * maxQsuc;
                        }//done calc. expected future reward
                    }
                    _m_QValues[t](sI,jaI) = R_i + gamma*R_f;
                }//end for jaI
            }//end for sI
            StopTimer("Iteration");
            if(t == 0) //escape from (loop t is unsigned!)
                break;
        }
    }
    else // infinite horizon problem
    {
        double maxDelta=DBL_MAX;
        QTable oldQtable;
        
        while(maxDelta>1e-4)
        {
            StartTimer("Iteration");
            maxDelta=0;
            oldQtable=_m_QValues[0];
            for(Index jaI = 0; jaI < nrJA; jaI++)
            {
                for(typename M::const_iterator1 ri=T[jaI]->begin1();
                    ri!=T[jaI]->end1(); ++ri)
                {
                    sI=ri.index1();
                    
                    //calc. expected immediate reward
                    R_i = immReward(sI,jaI);
                    R_f = 0.0;
                    //calc. expected future reward
                    
                    for (typename M::const_iterator2 ci = ri.begin();
                         ci != ri.end(); ++ci)
                    {
                        ssucI=ci.index2();
                        
                        //find the best action at ssucI
                        maxQsuc = -DBL_MAX;
                        for(Index jasucI = 0; jasucI < nrJA; jasucI++)
                            maxQsuc = std::max( oldQtable(ssucI,jasucI),
                                                maxQsuc);
                            
                        R_f += *ci * maxQsuc;
                    }//done calc. expected future reward
                    
                    _m_QValues[0](sI,jaI) = R_i + gamma*R_f;
                    maxDelta=std::max(maxDelta,
                                      std::abs(oldQtable(sI,jaI)-
                                               _m_QValues[0](sI,jaI)));
                }//end for jaI
            }//end for sI
            
            StopTimer("Iteration");

#if DEBUG_MDPValueIteration
            std::cout << "delta " << maxDelta << std::endl;
            PrintTimersSummary();
#endif
        }
    }
}